

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O1

shared_ptr<const_QGradientCache::CacheInfo> __thiscall
QGradientCache::addCacheElement
          (QGradientCache *this,quint64 hash_val,QGradient *gradient,int opacity)

{
  Chain *pCVar1;
  const_iterator it;
  size_t sVar2;
  size_t sVar3;
  Chain **ppCVar4;
  uint uVar5;
  InterpolationMode IVar6;
  uint uVar7;
  Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
  *pDVar8;
  void *pvVar9;
  ulong uVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  undefined4 in_register_0000000c;
  QGradient *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  MultiNodeChain<std::shared_ptr<const_QGradientCache::CacheInfo>_> **ppMVar13;
  long lVar14;
  int in_R8D;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ulong uVar16;
  long in_FS_OFFSET;
  shared_ptr<const_QGradientCache::CacheInfo> sVar17;
  shared_ptr<const_QGradientCache::CacheInfo> local_88;
  iterator local_78;
  Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
  *local_58;
  size_t sStack_50;
  MultiNodeChain<std::shared_ptr<const_QGradientCache::CacheInfo>_> **local_48;
  QGradient *local_40;
  long local_38;
  
  this_00 = (QGradient *)CONCAT44(in_register_0000000c,opacity);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(hash_val + 8) != 0x3c) goto LAB_003cac69;
  pDVar8 = *(Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
             **)hash_val;
  if (pDVar8 == (Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
                 *)0x0) {
    pDVar8 = (Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
              *)0x0;
    uVar16 = 0;
LAB_003cab81:
    ppMVar13 = (MultiNodeChain<std::shared_ptr<const_QGradientCache::CacheInfo>_> **)0x0;
  }
  else {
    if (1 < (uint)(pDVar8->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      pDVar8 = QHashPrivate::
               Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
               ::detached(pDVar8);
      *(Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
        **)hash_val = pDVar8;
    }
    pDVar8 = *(Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
               **)hash_val;
    if (pDVar8->spans->offsets[0] == 0xff) {
      uVar10 = 1;
      do {
        uVar16 = uVar10;
        if (pDVar8->numBuckets == uVar16) {
          pDVar8 = (Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
                    *)0x0;
          uVar16 = 0;
          break;
        }
        uVar10 = uVar16 + 1;
      } while (pDVar8->spans[uVar16 >> 7].offsets[(uint)uVar16 & 0x7f] == 0xff);
    }
    else {
      uVar16 = 0;
    }
    if (pDVar8 == (Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
                   *)0x0) goto LAB_003cab81;
    ppMVar13 = (MultiNodeChain<std::shared_ptr<const_QGradientCache::CacheInfo>_> **)
               (pDVar8->spans[uVar16 >> 7].entries
                [pDVar8->spans[uVar16 >> 7].offsets[(uint)uVar16 & 0x7f]].storage.data + 8);
  }
  pvVar9 = (void *)QRandomGenerator64::global();
  uVar5 = QRandomGenerator::_fillRange(pvVar9,0);
  if (0x4444444 < (ulong)uVar5) {
    uVar10 = (ulong)uVar5 * 0x3c >> 0x20;
    do {
      if ((*ppMVar13)->next ==
          (MultiNodeChain<std::shared_ptr<const_QGradientCache::CacheInfo>_> *)0x0) {
        do {
          if (pDVar8->numBuckets - 1 == uVar16) {
            uVar16 = 0;
            pDVar8 = (Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
                      *)0x0;
            break;
          }
          uVar16 = uVar16 + 1;
        } while (pDVar8->spans[uVar16 >> 7].offsets[(uint)uVar16 & 0x7f] == 0xff);
        if (pDVar8 == (Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
                       *)0x0) {
          ppMVar13 = (MultiNodeChain<std::shared_ptr<const_QGradientCache::CacheInfo>_> **)0x0;
        }
        else {
          ppMVar13 = (MultiNodeChain<std::shared_ptr<const_QGradientCache::CacheInfo>_> **)
                     (pDVar8->spans[uVar16 >> 7].entries
                      [pDVar8->spans[uVar16 >> 7].offsets[(uint)uVar16 & 0x7f]].storage.data + 8);
        }
      }
      else {
        ppMVar13 = &(*ppMVar13)->next;
      }
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  it.i.bucket = uVar16;
  it.i.d = pDVar8;
  it.e = ppMVar13;
  local_58 = pDVar8;
  sStack_50 = uVar16;
  local_48 = ppMVar13;
  QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>::erase
            (&local_78,
             (QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_> *)
             hash_val,it);
LAB_003cac69:
  QGradient::stops((QGradientStops *)&local_78,this_00);
  IVar6 = QGradient::interpolationMode(this_00);
  p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x3030);
  ppCVar4 = local_78.e;
  sVar2 = local_78.i.bucket;
  pDVar8 = local_78.i.d;
  p_Var11->_M_use_count = 1;
  p_Var11->_M_weak_count = 1;
  p_Var11->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_007eb350;
  local_78.e = (Chain **)0x0;
  local_78.i.d = (Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
                  *)0x0;
  local_78.i.bucket = 0;
  sVar3 = local_78.i.bucket;
  p_Var11[0x301]._vptr__Sp_counted_base = (_func_int **)pDVar8;
  local_78.i.bucket._0_4_ = (undefined4)sVar2;
  local_78.i.bucket._4_4_ = SUB84(sVar2,4);
  p_Var11[0x301]._M_use_count = (undefined4)local_78.i.bucket;
  p_Var11[0x301]._M_weak_count = local_78.i.bucket._4_4_;
  p_Var11[0x302]._vptr__Sp_counted_base = (_func_int **)ppCVar4;
  p_Var11[0x302]._M_use_count = in_R8D;
  p_Var11[0x302]._M_weak_count = IVar6;
  local_78.i.bucket = sVar3;
  generateGradientColorTable
            ((QGradientCache *)hash_val,this_00,(QRgba64 *)(p_Var11 + 1),0x400,in_R8D);
  p_Var15 = p_Var11 + 0x201;
  lVar14 = 0x10;
  do {
    uVar7 = QRgba64::toArgb32((QRgba64 *)((long)&p_Var11->_vptr__Sp_counted_base + lVar14));
    *(uint *)&p_Var15->_vptr__Sp_counted_base = uVar7;
    p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&p_Var15->_vptr__Sp_counted_base + 4);
    lVar14 = lVar14 + 8;
  } while (lVar14 != 0x2010);
  local_88.super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var11 + 1);
  local_88.super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var11;
  local_40 = gradient;
  QMultiHash<unsigned_long_long,std::shared_ptr<QGradientCache::CacheInfo_const>>::
  emplace<std::shared_ptr<QGradientCache::CacheInfo_const>const&>
            (&local_78,(void *)hash_val,(unsigned_long_long *)&local_40,&local_88);
  pCVar1 = *local_78.e;
  (this->cache).d =
       (Data *)(pCVar1->value).
               super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
  p_Var15 = (pCVar1->value).
            super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->cache).m_size = (qsizetype)p_Var15;
  if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
    }
  }
  _Var12._M_pi = extraout_RDX;
  if (local_88.super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.
               super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var12._M_pi = extraout_RDX_00;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  sVar17.super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var12._M_pi;
  sVar17.super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_QGradientCache::CacheInfo>)
         sVar17.super___shared_ptr<const_QGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const CacheInfo> addCacheElement(quint64 hash_val, const QGradient &gradient, int opacity) {
        if (cache.size() == maxCacheSize()) {
            // may remove more than 1, but OK
            cache.erase(std::next(cache.begin(), QRandomGenerator::global()->bounded(maxCacheSize())));
        }
        auto cache_entry = std::make_shared<CacheInfo>(gradient.stops(), opacity, gradient.interpolationMode());
        generateGradientColorTable(gradient, cache_entry->buffer64, paletteSize(), opacity);
        for (int i = 0; i < GRADIENT_STOPTABLE_SIZE; ++i)
            cache_entry->buffer32[i] = cache_entry->buffer64[i].toArgb32();
        return cache.insert(hash_val, std::move(cache_entry)).value();
    }